

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O0

value_ptr __thiscall ent::value::readvalue(value *this,uint32_t id,ByteVector *data)

{
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
  *this_00;
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint32_t next;
  const_reference mem;
  size_type size;
  stringvalue *this_01;
  binaryvalue *this_02;
  dwordvalue *this_03;
  stringlistvalue *this_04;
  muistringvalue *this_05;
  undefined8 uVar4;
  undefined8 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  value_ptr vVar6;
  string local_e8;
  undefined4 local_c4;
  undefined1 local_c0 [8];
  ByteVector valdata;
  string name;
  Wstring w;
  uint16_t namlen;
  uint16_t vallen;
  uint16_t type;
  undefined1 local_48 [4];
  uint32_t nextvalue;
  MemoryReader r;
  ByteVector *data_local;
  uint32_t id_local;
  
  r._curpos = (uint64_t)data;
  mem = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front(data);
  size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)r._curpos);
  MemoryReader::MemoryReader((MemoryReader *)local_48,mem,size);
  next = ReadWriter::read32le((ReadWriter *)local_48);
  uVar1 = ReadWriter::read16le((ReadWriter *)local_48);
  uVar2 = ReadWriter::read16le((ReadWriter *)local_48);
  uVar3 = ReadWriter::read16le((ReadWriter *)local_48);
  this_00 = (basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
             *)((long)&name.field_2 + 8);
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  basic_string(this_00);
  readutf16le<MemoryReader*>((MemoryReader *)local_48,this_00,(ulong)uVar3);
  ToString<unsigned_short>
            ((string *)
             &valdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
              *)((long)&name.field_2 + 8));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
  vectorread8<MemoryReader*>
            ((MemoryReader *)local_48,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0,(ulong)uVar2);
  switch(uVar1) {
  case 1:
    this_01 = (stringvalue *)operator_new(0x90);
    stringvalue::stringvalue
              (this_01,id,next,
               (string *)
               &valdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ByteVector *)local_c0);
    std::shared_ptr<ent::value>::shared_ptr<ent::stringvalue,void>
              ((shared_ptr<ent::value> *)this,this_01);
    break;
  default:
    uVar4 = std::__cxx11::string::c_str();
    vhexdump<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_e8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
    uVar5 = std::__cxx11::string::c_str();
    printf("WARNING: unsupported value type %d ( next:%08x name:%s, val:%s )\n",(ulong)uVar1,
           (ulong)next,uVar4,uVar5);
    std::__cxx11::string::~string((string *)&local_e8);
    std::shared_ptr<ent::value>::shared_ptr((shared_ptr<ent::value> *)this);
    break;
  case 3:
    this_02 = (binaryvalue *)operator_new(0x88);
    binaryvalue::binaryvalue
              (this_02,id,next,
               (string *)
               &valdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ByteVector *)local_c0);
    std::shared_ptr<ent::value>::shared_ptr<ent::binaryvalue,void>
              ((shared_ptr<ent::value> *)this,this_02);
    break;
  case 4:
    this_03 = (dwordvalue *)operator_new(0x78);
    dwordvalue::dwordvalue
              (this_03,id,next,
               (string *)
               &valdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ByteVector *)local_c0);
    std::shared_ptr<ent::value>::shared_ptr<ent::dwordvalue,void>
              ((shared_ptr<ent::value> *)this,this_03);
    break;
  case 7:
    this_04 = (stringlistvalue *)operator_new(0x88);
    stringlistvalue::stringlistvalue
              (this_04,id,next,
               (string *)
               &valdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ByteVector *)local_c0);
    std::shared_ptr<ent::value>::shared_ptr<ent::stringlistvalue,void>
              ((shared_ptr<ent::value> *)this,this_04);
    break;
  case 0x15:
    this_05 = (muistringvalue *)operator_new(0x90);
    muistringvalue::muistringvalue
              (this_05,id,next,
               (string *)
               &valdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ByteVector *)local_c0);
    std::shared_ptr<ent::value>::shared_ptr<ent::muistringvalue,void>
              ((shared_ptr<ent::value> *)this,this_05);
  }
  local_c4 = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
  std::__cxx11::string::~string
            ((string *)
             &valdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  ~basic_string((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                 *)((long)&name.field_2 + 8));
  MemoryReader::~MemoryReader((MemoryReader *)local_48);
  vVar6.super___shared_ptr<ent::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar6.super___shared_ptr<ent::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (value_ptr)vVar6.super___shared_ptr<ent::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr value::readvalue(uint32_t id, const ByteVector& data)
{
    MemoryReader r(&data.front(), data.size());
    uint32_t nextvalue= r.read32le();
    uint16_t type= r.read16le();   // 1, 3, 4, 7, 21
    uint16_t vallen= r.read16le();  // max 0xc5a
    uint16_t namlen= r.read16le();  // max 0x75

    std::Wstring w;
    readutf16le(&r, w, namlen);
    std::string name= ToString(w);

    ByteVector valdata;
    vectorread8(&r, valdata, vallen);

    switch(type)
    {
        case VT_STRING: return value_ptr(new stringvalue(id, nextvalue, name, valdata));
        case VT_BINARY: return value_ptr(new binaryvalue(id, nextvalue, name, valdata));
        case VT_DWORD:  return value_ptr(new dwordvalue(id, nextvalue, name, valdata));
        case VT_STRINGLIST: return value_ptr(new stringlistvalue(id, nextvalue, name, valdata));
        case VT_MUI:    return value_ptr(new muistringvalue(id, nextvalue, name, valdata));
        default:
                        printf("WARNING: unsupported value type %d ( next:%08x name:%s, val:%s )\n", type, nextvalue, name.c_str(), vhexdump(valdata).c_str());
    }
    return value_ptr();
}